

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O2

void __thiscall tvm::runtime::FunctionInfo::Save(FunctionInfo *this,JSONWriter *writer)

{
  pointer paVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  long lVar3;
  size_t i;
  ulong uVar4;
  allocator<char> local_61;
  string local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sarg_types;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&sarg_types,
           (long)(this->arg_types).super__Vector_base<DLDataType,_std::allocator<DLDataType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->arg_types).super__Vector_base<DLDataType,_std::allocator<DLDataType>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_60);
  lVar3 = 0;
  uVar2 = extraout_RDX;
  for (uVar4 = 0;
      paVar1 = (this->arg_types).super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl
               .super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->arg_types).
                            super__Vector_base<DLDataType,_std::allocator<DLDataType>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)paVar1 >> 2);
      uVar4 = uVar4 + 1) {
    TVMType2String_abi_cxx11_(&local_60,(runtime *)(ulong)(uint)paVar1[uVar4],SUB84(uVar2,0));
    std::__cxx11::string::operator=
              ((string *)
               ((long)&((sarg_types.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3),
               (string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    lVar3 = lVar3 + 0x20;
    uVar2 = extraout_RDX_00;
  }
  dmlc::JSONWriter::BeginObject(writer,true);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"name",&local_61);
  dmlc::JSONWriter::WriteObjectKeyValue<std::__cxx11::string>(writer,&local_60,&this->name);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"arg_types",&local_61);
  dmlc::JSONWriter::
  WriteObjectKeyValue<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (writer,&local_60,&sarg_types);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"thread_axis_tags",&local_61);
  dmlc::JSONWriter::
  WriteObjectKeyValue<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (writer,&local_60,&this->thread_axis_tags);
  std::__cxx11::string::~string((string *)&local_60);
  dmlc::JSONWriter::EndObject(writer);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&sarg_types);
  return;
}

Assistant:

void FunctionInfo::Save(dmlc::JSONWriter *writer) const {
  std::vector<std::string> sarg_types(arg_types.size());
  for (size_t i = 0; i < arg_types.size(); ++i) {
    sarg_types[i] = TVMType2String(arg_types[i]);
  }
  writer->BeginObject();
  writer->WriteObjectKeyValue("name", name);
  writer->WriteObjectKeyValue("arg_types", sarg_types);
  writer->WriteObjectKeyValue("thread_axis_tags", thread_axis_tags);
  writer->EndObject();
}